

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# problem_1.cpp
# Opt level: O2

void file_to_lower(string *in_filename,string *out_filename)

{
  istream *piVar1;
  ostream *poVar2;
  string line;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_450;
  ofstream out_file;
  byte abStack_410 [480];
  ifstream in_file;
  byte abStack_210 [488];
  
  std::ifstream::ifstream(&in_file,(string *)in_filename,_S_in);
  if ((abStack_210[*(long *)(_in_file + -0x18)] & 5) != 0) {
    std::operator+(&line,"Could not open file \'",in_filename);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&out_file,
                   &line,"\' for reading.");
    error((string *)&out_file);
    std::__cxx11::string::~string((string *)&out_file);
    std::__cxx11::string::~string((string *)&line);
  }
  std::ofstream::ofstream(&out_file,(string *)out_filename,_S_out);
  if ((abStack_410[*(long *)(_out_file + -0x18)] & 5) != 0) {
    std::operator+(&local_450,"Could not open file \'",in_filename);
    std::operator+(&line,&local_450,"\' for reading.");
    error(&line);
    std::__cxx11::string::~string((string *)&line);
    std::__cxx11::string::~string((string *)&local_450);
  }
  line._M_dataplus._M_p = (pointer)&line.field_2;
  line._M_string_length = 0;
  line.field_2._M_local_buf[0] = '\0';
  while( true ) {
    piVar1 = std::getline<char,std::char_traits<char>,std::allocator<char>>
                       ((istream *)&in_file,(string *)&line);
    if (((byte)piVar1[*(long *)(*(long *)piVar1 + -0x18) + 0x20] & 5) != 0) break;
    to_lower(&local_450,&line);
    poVar2 = std::operator<<((ostream *)&out_file,(string *)&local_450);
    std::operator<<(poVar2,'\n');
    std::__cxx11::string::~string((string *)&local_450);
  }
  std::__cxx11::string::~string((string *)&line);
  std::ofstream::~ofstream(&out_file);
  std::ifstream::~ifstream(&in_file);
  return;
}

Assistant:

void file_to_lower(const std::string& in_filename, const std::string& out_filename)
{
	std::ifstream in_file{ in_filename };
	if (!in_file)
	{
		error("Could not open file '" + in_filename + "' for reading.");
	}
	std::ofstream out_file{ out_filename };
	if (!out_file)
	{
		error("Could not open file '" + in_filename + "' for reading.");
	}
	std::string line;
	while (std::getline(in_file, line))
	{
		out_file << to_lower(line) << '\n';
	}
}